

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Problem.cpp
# Opt level: O3

void __thiscall Kernel::Problem::addUnits(Problem *this,UnitList *newUnits)

{
  undefined1 *puVar1;
  List<Kernel::Unit_*> *pLVar2;
  UnitList *pUVar3;
  List<Kernel::Unit_*> *pLVar4;
  UnitList *pUVar5;
  UnitList *pUVar6;
  
  pLVar4 = newUnits;
  if (newUnits == (UnitList *)0x0) {
    pUVar5 = this->_units;
  }
  else {
    do {
      pLVar2 = pLVar4->_tail;
      if ((pLVar4->_head->field_0x4 & 1) == 0) {
        puVar1 = &pLVar4->_head[1]._inference.field_0x8;
        *(int *)puVar1 = *(int *)puVar1 + 1;
      }
      pLVar4 = pLVar2;
    } while (pLVar2 != (List<Kernel::Unit_*> *)0x0);
    pUVar3 = this->_units;
    pUVar5 = pUVar3;
    if ((newUnits != (UnitList *)0x0) &&
       (pUVar5 = newUnits, pLVar4 = newUnits, pUVar3 != (UnitList *)0x0)) {
      do {
        pUVar6 = pLVar4;
        pLVar4 = pUVar6->_tail;
      } while (pLVar4 != (List<Kernel::Unit_*> *)0x0);
      pUVar6->_tail = pUVar3;
    }
  }
  this->_units = pUVar5;
  if (this->_propertyValid != true) {
    this->_propertyValid = false;
    this->_hasFormulas = Unknown;
    this->_hasEquality = Unknown;
    this->_hasInterpretedOperations = Unknown;
    this->_hasNumerals = Unknown;
    this->_hasAlascaArithmetic = Unknown;
    this->_hasFOOL = Unknown;
    this->_hasCombs = Unknown;
    this->_hasApp = Unknown;
    (this->_hasAppliedVar)._value = Unknown;
    this->_mayHaveEquality = true;
    this->_mayHaveFormulas = true;
    this->_mayHaveFunctionDefinitions = true;
    this->_mayHaveInequalityResolvableWithDeletion = true;
    this->_mayHaveXEqualsY = true;
    return;
  }
  Shell::Property::add(this->_property,newUnits);
  readDetailsFromProperty(this);
  return;
}

Assistant:

void Problem::addUnits(UnitList* newUnits)
{
  UnitList::Iterator uit(newUnits);
  while(uit.hasNext()) {
    Unit* u = uit.next();
    if(u->isClause()) {
      static_cast<Clause*>(u)->incRefCnt();
    }
  }
  _units = UnitList::concat(newUnits, _units);
  if(_propertyValid) {
    TIME_TRACE(TimeTrace::PROPERTY_EVALUATION);
    _property->add(newUnits);
    readDetailsFromProperty();
  }
  else {
    invalidateEverything();
  }
}